

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# border_misc.cpp
# Opt level: O1

void Am_Draw_Motif_Box(int left,int top,int width,int height,bool depressed,
                      Computed_Colors_Record *rec,Am_Drawonable *draw)

{
  ulong uVar1;
  uint uVar2;
  long lVar3;
  Am_Style bot_fill;
  Am_Style top_fill;
  Am_Style inside_fill;
  
  Am_Style::Am_Style(&top_fill);
  Am_Style::Am_Style(&bot_fill);
  Am_Style::Am_Style(&inside_fill);
  if (depressed) {
    Am_Style::operator=(&top_fill,&rec->data->shadow_style);
    lVar3 = 0x20;
    Am_Style::operator=(&bot_fill,&rec->data->highlight_style);
  }
  else {
    Am_Style::operator=(&top_fill,&rec->data->highlight_style);
    lVar3 = 0x18;
    Am_Style::operator=(&bot_fill,&rec->data->shadow_style);
  }
  Am_Style::operator=(&inside_fill,
                      (Am_Style *)
                      ((long)&(rec->data->super_Am_Wrapper).super_Am_Registered_Type.
                              _vptr_Am_Registered_Type + lVar3));
  (*draw->_vptr_Am_Drawonable[0x2c])
            (draw,&Am_No_Style,&top_fill,(ulong)(uint)left,(ulong)(uint)top,(ulong)(uint)width,
             (ulong)(uint)height,0);
  uVar2 = (width + left) - 1;
  uVar1 = (ulong)(uint)(height + -1 + top);
  (*draw->_vptr_Am_Drawonable[0x2a])
            (draw,&bot_fill,&Am_No_Style,(ulong)uVar2,(ulong)(top + 1),(ulong)uVar2,uVar1,
             (ulong)(left + 1),uVar1,0);
  uVar2 = (width + left) - 2;
  uVar1 = (ulong)((height + top) - 2);
  (*draw->_vptr_Am_Drawonable[0x2a])
            (draw,&bot_fill,&Am_No_Style,(ulong)uVar2,(ulong)(top + 2U),(ulong)uVar2,uVar1,
             (ulong)(left + 2),uVar1,0);
  (*draw->_vptr_Am_Drawonable[0x2c])
            (draw,&Am_No_Style,&inside_fill,(ulong)(left + 2),(ulong)(top + 2U),(ulong)(width - 4),
             (ulong)(height - 4),0);
  Am_Style::~Am_Style(&inside_fill);
  Am_Style::~Am_Style(&bot_fill);
  Am_Style::~Am_Style(&top_fill);
  return;
}

Assistant:

void
Am_Draw_Motif_Box(int left, int top, int width, int height, bool depressed,
                  const Computed_Colors_Record &rec, Am_Drawonable *draw)
{
  Am_Style top_fill;
  Am_Style bot_fill;
  Am_Style inside_fill;
  if (depressed) {
    top_fill = rec.data->shadow_style;
    bot_fill = rec.data->highlight_style;
    inside_fill = rec.data->background_style;
  } else {
    top_fill = rec.data->highlight_style;
    bot_fill = rec.data->shadow_style;
    inside_fill = rec.data->foreground_style;
  }
  //top edges
  draw->Draw_Rectangle(Am_No_Style, top_fill, left, top, width, height);
  //bottom edges
  draw->Draw_2_Lines(bot_fill, Am_No_Style, left + width - 1, top + 1,
                     left + width - 1, top + height - 1, left + 1,
                     top + height - 1);
  draw->Draw_2_Lines(bot_fill, Am_No_Style, left + width - 2, top + 2,
                     left + width - 2, top + height - 2, left + 2,
                     top + height - 2);

  //inside of box
  draw->Draw_Rectangle(Am_No_Style, inside_fill, left + 2, top + 2, width - 4,
                       height - 4);
}